

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O0

int ipv4_tbl_addr_cmp(zt_ipv4_addr *haystack,zt_ipv4_addr *needle)

{
  zt_ipv4_addr *needle_local;
  zt_ipv4_addr *haystack_local;
  int local_4;
  
  if ((haystack == (zt_ipv4_addr *)0x0) || (needle == (zt_ipv4_addr *)0x0)) {
    local_4 = 0;
  }
  else if ((needle->addr < haystack->addr) || (haystack->broadcast < needle->broadcast)) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int
ipv4_tbl_addr_cmp(zt_ipv4_addr * haystack, zt_ipv4_addr * needle)
{
    if (!haystack || !needle) {
        return 0;
    }

    if (needle->addr >= haystack->addr &&
        needle->broadcast <= haystack->broadcast) {
        return 1;
    }

    return 0;
}